

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O3

void __thiscall proto3_unittest::TestOneof2::clear_foo(TestOneof2 *this)

{
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestOneof2::clear_foo() {
// @@protoc_insertion_point(one_of_clear_start:proto3_unittest.TestOneof2)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (foo_case()) {
    case kFooEnum: {
      // No need to clear
      break;
    }
    case FOO_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = FOO_NOT_SET;
}